

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_allintra_speed_feature_framesize_dependent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  _Bool use_hbd;
  int is_4k_or_larger;
  int is_1080p_or_larger;
  int is_720p_or_larger;
  int is_480p_or_larger;
  AV1_COMMON *cm;
  int speed_local;
  SPEED_FEATURES *sf_local;
  AV1_COMP *cpi_local;
  
  if ((cpi->common).width < (cpi->common).height) {
    local_38 = (cpi->common).width;
  }
  else {
    local_38 = (cpi->common).height;
  }
  bVar1 = 0x1df < local_38;
  if ((cpi->common).width < (cpi->common).height) {
    local_3c = (cpi->common).width;
  }
  else {
    local_3c = (cpi->common).height;
  }
  bVar2 = 0x2cf < local_3c;
  if ((cpi->common).width < (cpi->common).height) {
    local_40 = (cpi->common).width;
  }
  else {
    local_40 = (cpi->common).height;
  }
  if ((cpi->common).width < (cpi->common).height) {
    local_44 = (cpi->common).width;
  }
  else {
    local_44 = (cpi->common).height;
  }
  bVar3 = (cpi->oxcf).use_highbitdepth & 1;
  if (bVar1) {
    (sf->part_sf).use_square_partition_only_threshold = BLOCK_128X128;
    if (bVar2) {
      (sf->part_sf).auto_max_partition_based_on_simple_motion = '\x03';
    }
    else {
      (sf->part_sf).auto_max_partition_based_on_simple_motion = '\x02';
    }
  }
  else {
    (sf->part_sf).use_square_partition_only_threshold = BLOCK_64X64;
    (sf->part_sf).auto_max_partition_based_on_simple_motion = '\x01';
    if (bVar3 != 0) {
      (sf->tx_sf).prune_tx_size_level = 1;
    }
  }
  if (0x86f < local_44) {
    (sf->part_sf).default_min_partition_size = BLOCK_8X8;
  }
  if (bVar2) {
    (sf->mv_sf).use_downsampled_sad = 2;
  }
  else {
    (sf->part_sf).ml_partition_search_breakout_thresh[0] = 200;
    (sf->part_sf).ml_partition_search_breakout_thresh[1] = 0xfa;
    (sf->part_sf).ml_partition_search_breakout_thresh[2] = 300;
    (sf->part_sf).ml_partition_search_breakout_thresh[3] = 500;
    (sf->part_sf).ml_partition_search_breakout_thresh[4] = -1;
    (sf->part_sf).ml_early_term_after_part_split_level = 1;
  }
  if (0 < speed) {
    if (bVar2) {
      (sf->part_sf).use_square_partition_only_threshold = BLOCK_128X128;
    }
    else if (bVar1) {
      (sf->part_sf).use_square_partition_only_threshold = BLOCK_64X64;
    }
    else {
      (sf->part_sf).use_square_partition_only_threshold = BLOCK_32X32;
    }
    if (!bVar2) {
      (sf->part_sf).ml_partition_search_breakout_thresh[0] = 200;
      (sf->part_sf).ml_partition_search_breakout_thresh[1] = 0xfa;
      (sf->part_sf).ml_partition_search_breakout_thresh[2] = 300;
      (sf->part_sf).ml_partition_search_breakout_thresh[3] = 300;
      (sf->part_sf).ml_partition_search_breakout_thresh[4] = -1;
    }
    (sf->part_sf).ml_early_term_after_part_split_level = 2;
  }
  if (1 < speed) {
    if (bVar2) {
      (sf->part_sf).use_square_partition_only_threshold = BLOCK_64X64;
    }
    else if (bVar1) {
      (sf->part_sf).use_square_partition_only_threshold = BLOCK_32X32;
    }
    else {
      (sf->part_sf).use_square_partition_only_threshold = BLOCK_32X32;
    }
    if (bVar2) {
      (sf->part_sf).partition_search_breakout_dist_thr = 0x1000000;
      (sf->part_sf).partition_search_breakout_rate_thr = 0x78;
    }
    else {
      (sf->part_sf).partition_search_breakout_dist_thr = 0x400000;
      (sf->part_sf).partition_search_breakout_rate_thr = 100;
    }
    if (bVar1) {
      (sf->tx_sf).tx_type_search.prune_tx_type_using_stats = 1;
      if (bVar3 != 0) {
        (sf->tx_sf).prune_tx_size_level = 2;
      }
    }
    else if (bVar3 != 0) {
      (sf->tx_sf).prune_tx_size_level = 3;
    }
  }
  if (2 < speed) {
    (sf->part_sf).ml_early_term_after_part_split_level = 0;
    if (bVar2) {
      (sf->part_sf).partition_search_breakout_dist_thr = 0x2000000;
      (sf->part_sf).partition_search_breakout_rate_thr = 200;
    }
    else {
      (sf->part_sf).max_intra_bsize = BLOCK_32X32;
      (sf->part_sf).partition_search_breakout_dist_thr = 0x800000;
      (sf->part_sf).partition_search_breakout_rate_thr = 0x78;
    }
    if (bVar3 != 0) {
      (sf->tx_sf).prune_tx_size_level = 3;
    }
  }
  if (3 < speed) {
    if (bVar2) {
      (sf->part_sf).partition_search_breakout_dist_thr = 0x4000000;
    }
    else {
      (sf->part_sf).partition_search_breakout_dist_thr = 0x1000000;
    }
    if (bVar1) {
      (sf->tx_sf).tx_type_search.prune_tx_type_using_stats = 2;
    }
  }
  if (5 < speed) {
    if (bVar2) {
      (sf->part_sf).auto_max_partition_based_on_simple_motion = '\0';
    }
    else if (bVar1) {
      (sf->part_sf).auto_max_partition_based_on_simple_motion = '\x01';
    }
    if (0x437 < local_40) {
      (sf->part_sf).default_min_partition_size = BLOCK_8X8;
    }
    (sf->part_sf).use_square_partition_only_threshold = BLOCK_16X16;
  }
  if (7 < speed) {
    if (!bVar1) {
      (sf->rt_sf).nonrd_check_partition_merge_mode = 2;
    }
    if (bVar2) {
      (sf->rt_sf).force_large_partition_blocks_intra = 1;
    }
  }
  if ((8 < speed) && (0x86f >= local_44)) {
    (sf->inter_sf).coeff_cost_upd_level = INTERNAL_COST_UPD_OFF;
    (sf->inter_sf).mode_cost_upd_level = INTERNAL_COST_UPD_OFF;
  }
  return;
}

Assistant:

static void set_allintra_speed_feature_framesize_dependent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf, int speed) {
  const AV1_COMMON *const cm = &cpi->common;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_1080p_or_larger = AOMMIN(cm->width, cm->height) >= 1080;
  const int is_4k_or_larger = AOMMIN(cm->width, cm->height) >= 2160;
  const bool use_hbd = cpi->oxcf.use_highbitdepth;

  if (is_480p_or_larger) {
    sf->part_sf.use_square_partition_only_threshold = BLOCK_128X128;
    if (is_720p_or_larger)
      sf->part_sf.auto_max_partition_based_on_simple_motion = ADAPT_PRED;
    else
      sf->part_sf.auto_max_partition_based_on_simple_motion = RELAXED_PRED;
  } else {
    sf->part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    sf->part_sf.auto_max_partition_based_on_simple_motion = DIRECT_PRED;
    if (use_hbd) sf->tx_sf.prune_tx_size_level = 1;
  }

  if (is_4k_or_larger) {
    sf->part_sf.default_min_partition_size = BLOCK_8X8;
  }

  // TODO(huisu@google.com): train models for 720P and above.
  if (!is_720p_or_larger) {
    sf->part_sf.ml_partition_search_breakout_thresh[0] = 200;  // BLOCK_8X8
    sf->part_sf.ml_partition_search_breakout_thresh[1] = 250;  // BLOCK_16X16
    sf->part_sf.ml_partition_search_breakout_thresh[2] = 300;  // BLOCK_32X32
    sf->part_sf.ml_partition_search_breakout_thresh[3] = 500;  // BLOCK_64X64
    sf->part_sf.ml_partition_search_breakout_thresh[4] = -1;   // BLOCK_128X128
    sf->part_sf.ml_early_term_after_part_split_level = 1;
  }

  if (is_720p_or_larger) {
    // TODO(chiyotsai@google.com): make this speed feature adaptive based on
    // current block's vertical texture instead of hardcoded with resolution
    sf->mv_sf.use_downsampled_sad = 2;
  }

  if (speed >= 1) {
    if (is_720p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_128X128;
    } else if (is_480p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    } else {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    }

    if (!is_720p_or_larger) {
      sf->part_sf.ml_partition_search_breakout_thresh[0] = 200;  // BLOCK_8X8
      sf->part_sf.ml_partition_search_breakout_thresh[1] = 250;  // BLOCK_16X16
      sf->part_sf.ml_partition_search_breakout_thresh[2] = 300;  // BLOCK_32X32
      sf->part_sf.ml_partition_search_breakout_thresh[3] = 300;  // BLOCK_64X64
      sf->part_sf.ml_partition_search_breakout_thresh[4] = -1;  // BLOCK_128X128
    }
    sf->part_sf.ml_early_term_after_part_split_level = 2;
  }

  if (speed >= 2) {
    if (is_720p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_64X64;
    } else if (is_480p_or_larger) {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    } else {
      sf->part_sf.use_square_partition_only_threshold = BLOCK_32X32;
    }

    if (is_720p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 24);
      sf->part_sf.partition_search_breakout_rate_thr = 120;
    } else {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 22);
      sf->part_sf.partition_search_breakout_rate_thr = 100;
    }

    if (is_480p_or_larger) {
      sf->tx_sf.tx_type_search.prune_tx_type_using_stats = 1;
      if (use_hbd) sf->tx_sf.prune_tx_size_level = 2;
    } else {
      if (use_hbd) sf->tx_sf.prune_tx_size_level = 3;
    }
  }

  if (speed >= 3) {
    sf->part_sf.ml_early_term_after_part_split_level = 0;

    if (is_720p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 25);
      sf->part_sf.partition_search_breakout_rate_thr = 200;
    } else {
      sf->part_sf.max_intra_bsize = BLOCK_32X32;
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 23);
      sf->part_sf.partition_search_breakout_rate_thr = 120;
    }
    if (use_hbd) sf->tx_sf.prune_tx_size_level = 3;
  }

  if (speed >= 4) {
    if (is_720p_or_larger) {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 26);
    } else {
      sf->part_sf.partition_search_breakout_dist_thr = (1 << 24);
    }

    if (is_480p_or_larger) {
      sf->tx_sf.tx_type_search.prune_tx_type_using_stats = 2;
    }
  }

  if (speed >= 6) {
    if (is_720p_or_larger) {
      sf->part_sf.auto_max_partition_based_on_simple_motion = NOT_IN_USE;
    } else if (is_480p_or_larger) {
      sf->part_sf.auto_max_partition_based_on_simple_motion = DIRECT_PRED;
    }

    if (is_1080p_or_larger) {
      sf->part_sf.default_min_partition_size = BLOCK_8X8;
    }

    sf->part_sf.use_square_partition_only_threshold = BLOCK_16X16;
  }

  if (speed >= 7) {
    // TODO(kyslov): add more speed features to control speed/quality
  }

  if (speed >= 8) {
    if (!is_480p_or_larger) {
      sf->rt_sf.nonrd_check_partition_merge_mode = 2;
    }
    if (is_720p_or_larger) {
      sf->rt_sf.force_large_partition_blocks_intra = 1;
    }
  }

  if (speed >= 9) {
    // TODO(kyslov): add more speed features to control speed/quality
    if (!is_4k_or_larger) {
      // In av1_select_sb_size(), superblock size is set to 64x64 only for
      // resolutions less than 4k in speed>=9, to improve the multithread
      // performance. If cost update levels are set to INTERNAL_COST_UPD_OFF
      // for resolutions >= 4k, the SB size setting can be modified for these
      // resolutions as well.
      sf->inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_OFF;
      sf->inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_OFF;
    }
  }
}